

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_widget.cpp
# Opt level: O1

void __thiscall nesvis::PpuWidget::draw_patterntables(PpuWidget *this)

{
  bool bVar1;
  Texture *pTVar2;
  int i;
  ulong uVar3;
  ImVec2 local_38;
  
  local_38.x = 0.0;
  local_38.y = 0.0;
  bVar1 = ImGui::Button("Read data",&local_38);
  if (bVar1) {
    load_pattern_tables(this);
  }
  ImGui::Text("Pattern table 0");
  pTVar2 = (Texture *)&this->pattern_table_textures_;
  uVar3 = 0;
  do {
    if ((uVar3 & 0xf) != 0) {
      ImGui::SameLine(0.0,-1.0);
    }
    local_38.x = 16.0;
    local_38.y = 16.0;
    ImGui::Image(pTVar2,(Vector2f *)&local_38,(Color *)&sf::Color::White,
                 (Color *)&sf::Color::Transparent);
    bVar1 = ImGui::IsItemHovered(0);
    if (bVar1) {
      ImGui::BeginTooltip();
      ImGui::Text("Index: %02X",uVar3 & 0xffffffff);
      ImGui::EndTooltip();
    }
    uVar3 = uVar3 + 1;
    pTVar2 = pTVar2 + 1;
  } while (uVar3 != 0x100);
  ImGui::Text("Pattern table 1");
  pTVar2 = (Texture *)&(this->pattern_table_textures_).field_0x2800;
  uVar3 = 0;
  do {
    if (((int)uVar3 + 0x100U & 0xf) != 0) {
      ImGui::SameLine(0.0,-1.0);
    }
    local_38.x = 16.0;
    local_38.y = 16.0;
    ImGui::Image(pTVar2,(Vector2f *)&local_38,(Color *)&sf::Color::White,
                 (Color *)&sf::Color::Transparent);
    bVar1 = ImGui::IsItemHovered(0);
    if (bVar1) {
      ImGui::BeginTooltip();
      ImGui::Text("Index: %02X",uVar3 & 0xffffffff);
      ImGui::EndTooltip();
    }
    uVar3 = uVar3 + 1;
    pTVar2 = pTVar2 + 1;
  } while (uVar3 != 0x100);
  return;
}

Assistant:

void PpuWidget::draw_patterntables() {
    if (ImGui::Button("Read data")) {
        load_pattern_tables();
    }

    ImGui::Text("Pattern table 0");
    for (int i = 0; i < kPatternTableSize; ++i) {
        if (i % 16 != 0) {
            ImGui::SameLine();
        }
        ImGui::Image(pattern_table_textures_[i], {kSpriteSize, kSpriteSize});
        if (ImGui::IsItemHovered()) {
            ImGui::BeginTooltip();
            ImGui::Text("Index: %02X", i);
            ImGui::EndTooltip();
        }
    }
    ImGui::Text("Pattern table 1");
    for (int i = kPatternTableSize; i < kPatternTableSize * 2; ++i) {
        if (i % 16 != 0) {
            ImGui::SameLine();
        }
        ImGui::Image(pattern_table_textures_[i], {kSpriteSize, kSpriteSize});
        if (ImGui::IsItemHovered()) {
            ImGui::BeginTooltip();
            ImGui::Text("Index: %02X", i - kPatternTableSize);
            ImGui::EndTooltip();
        }
    }
}